

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiDockNode * ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode *node,ImVec2 pos)

{
  float fVar1;
  float fVar2;
  ImGuiDockNode *pIVar3;
  ImGuiDockNode *pIVar4;
  
  pIVar4 = (ImGuiDockNode *)0x0;
  while ((((pIVar3 = pIVar4, (node->field_0xc5 & 2) != 0 && (fVar1 = (node->Pos).x, fVar1 <= pos.x))
          && (fVar2 = (node->Pos).y, fVar2 <= pos.y)) &&
         (((pIVar3 = (ImGuiDockNode *)0x0, pos.x < fVar1 + (node->Size).x &&
           (pos.y < fVar2 + (node->Size).y)) &&
          ((pIVar3 = node, node->ChildNodes[0] != (ImGuiDockNode *)0x0 &&
           (pIVar3 = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[0],pos),
           pIVar3 == (ImGuiDockNode *)0x0))))))) {
    node = node->ChildNodes[1];
  }
  return pIVar3;
}

Assistant:

ImGuiDockNode* ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode* node, ImVec2 pos)
{
    if (!node->IsVisible)
        return NULL;

    const float dock_spacing = 0.0f;// g.Style.ItemInnerSpacing.x; // FIXME: Relation to DOCKING_SPLITTER_SIZE?
    ImRect r(node->Pos, node->Pos + node->Size);
    r.Expand(dock_spacing * 0.5f);
    bool inside = r.Contains(pos);
    if (!inside)
        return NULL;

    if (node->IsLeafNode())
        return node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[0], pos))
        return hovered_node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[1], pos))
        return hovered_node;

    return NULL;
}